

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O2

StringBuilder * __thiscall Potassco::StringBuilder::appendFormat(StringBuilder *this,char *fmt,...)

{
  char in_AL;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar5;
  size_t sVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  Buffer local_170;
  va_list args;
  Buffer local_140;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  char small [64];
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  pcVar3 = strchr(fmt,0x25);
  if (pcVar3 == (char *)0x0) {
    sVar6 = strlen(fmt);
  }
  else {
    sVar6 = (long)pcVar3 - (long)fmt;
  }
  if (sVar6 != 0) {
    append(this,fmt,sVar6);
    fmt = fmt + sVar6;
  }
  if (*fmt != '\0') {
    buffer(&local_170,this);
    if (local_170.size == local_170.used) {
      local_170.used = 0;
      local_170.size = 0x40;
      local_170.head = small;
    }
    pcVar3 = local_170.head;
    args[0].reg_save_area = local_128;
    args[0].overflow_arg_area = &stack0x00000008;
    args[0].gp_offset = 0x10;
    args[0].fp_offset = 0x30;
    sVar6 = local_170.size - local_170.used;
    uVar1 = ::vsnprintf(local_170.head + local_170.used,sVar6,fmt,args);
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
      if (uVar5 < sVar6) {
        if (pcVar3 == small) {
          append(this,pcVar3,uVar5);
        }
        else {
          grow(&local_140,this,uVar5);
        }
      }
      else {
        grow(&local_170,this,uVar5);
        args[0].reg_save_area = local_128;
        args[0].overflow_arg_area = &stack0x00000008;
        args[0].gp_offset = 0x10;
        args[0].fp_offset = 0x30;
        uVar5 = local_170.size - local_170.used;
        iVar2 = ::vsnprintf(local_170.head + local_170.used,uVar5 + 1,fmt,args);
        if (uVar5 < (ulong)(long)iVar2) {
          piVar4 = __errno_location();
          *piVar4 = 0x22;
        }
      }
    }
  }
  return this;
}

Assistant:

StringBuilder& StringBuilder::appendFormat(const char* fmt, ...) {
	const char* p = std::strchr(fmt, '%');
	std::size_t x = p ? static_cast<std::size_t>(p - fmt) : std::strlen(fmt);
	if (x) { append(fmt, x); fmt += x; }
	if (*fmt) {
		char small[64];
		Buffer buf = buffer();
		if (buf.free() == 0) { buf.head = small; buf.used = 0; buf.size = sizeof(small); }
		va_list args;
		va_start(args, fmt);
		int n = vsnprintf(buf.pos(), buf.free(), fmt, args);
		va_end(args);
		if (n > 0 && (x = static_cast<size_t>(n)) < buf.free()) {
			if (buf.head == small) { append(buf.head, x); }
			else                   { grow(x); }
			return *this;
		}
		if (n > 0) {
			buf = grow(static_cast<size_t>(n));
			va_start(args, fmt);
			x = static_cast<size_t>(Potassco::vsnprintf(buf.pos(), buf.free() + 1, fmt, args));
			va_end(args);
			if (x > buf.free()) { errno = ERANGE; }
		}
	}
	return *this;
}